

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask.c
# Opt level: O0

void aom_highbd_blend_a64_mask_c
               (uint8_t *dst_8,uint32_t dst_stride,uint8_t *src0_8,uint32_t src0_stride,
               uint8_t *src1_8,uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int w,int h,
               int subw,int subh,int bd)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int m_3;
  int m_2;
  int m_1;
  int m;
  uint16_t *src1;
  uint16_t *src0;
  uint16_t *dst;
  int j;
  int i;
  uint32_t src1_stride_local;
  uint8_t *src1_8_local;
  uint32_t src0_stride_local;
  uint8_t *src0_8_local;
  uint32_t dst_stride_local;
  uint8_t *dst_8_local;
  
  lVar2 = (long)dst_8 * 2;
  lVar3 = (long)src0_8 * 2;
  lVar4 = (long)src1_8 * 2;
  if ((subw == 0) && (subh == 0)) {
    for (i = 0; i < h; i = i + 1) {
      for (j = 0; j < w; j = j + 1) {
        *(short *)(lVar2 + (ulong)(i * dst_stride + j) * 2) =
             (short)((int)((uint)mask[i * mask_stride + j] *
                           (uint)*(ushort *)(lVar3 + (ulong)(i * src0_stride + j) * 2) +
                           (0x40 - (uint)mask[i * mask_stride + j]) *
                           (uint)*(ushort *)(lVar4 + (ulong)(i * src1_stride + j) * 2) + 0x20) >> 6)
        ;
      }
    }
  }
  else if ((subw == 1) && (subh == 1)) {
    for (i = 0; i < h; i = i + 1) {
      for (j = 0; j < w; j = j + 1) {
        iVar1 = (int)((uint)mask[i * 2 * mask_stride + j * 2] +
                      (uint)mask[(i * 2 + 1) * mask_stride + j * 2] +
                      (uint)mask[i * 2 * mask_stride + j * 2 + 1] +
                      (uint)mask[(i * 2 + 1) * mask_stride + j * 2 + 1] + 2) >> 2;
        *(short *)(lVar2 + (ulong)(i * dst_stride + j) * 2) =
             (short)((int)(iVar1 * (uint)*(ushort *)(lVar3 + (ulong)(i * src0_stride + j) * 2) +
                           (0x40 - iVar1) *
                           (uint)*(ushort *)(lVar4 + (ulong)(i * src1_stride + j) * 2) + 0x20) >> 6)
        ;
      }
    }
  }
  else if ((subw == 1) && (subh == 0)) {
    for (i = 0; i < h; i = i + 1) {
      for (j = 0; j < w; j = j + 1) {
        iVar1 = (int)((uint)mask[i * mask_stride + j * 2] + (uint)mask[i * mask_stride + j * 2 + 1]
                     + 1) >> 1;
        *(short *)(lVar2 + (ulong)(i * dst_stride + j) * 2) =
             (short)((int)(iVar1 * (uint)*(ushort *)(lVar3 + (ulong)(i * src0_stride + j) * 2) +
                           (0x40 - iVar1) *
                           (uint)*(ushort *)(lVar4 + (ulong)(i * src1_stride + j) * 2) + 0x20) >> 6)
        ;
      }
    }
  }
  else {
    for (i = 0; i < h; i = i + 1) {
      for (j = 0; j < w; j = j + 1) {
        iVar1 = (int)((uint)mask[i * 2 * mask_stride + j] +
                      (uint)mask[(i * 2 + 1) * mask_stride + j] + 1) >> 1;
        *(short *)(lVar2 + (ulong)(i * dst_stride + j) * 2) =
             (short)((int)(iVar1 * (uint)*(ushort *)(lVar3 + (ulong)(i * src0_stride + j) * 2) +
                           (0x40 - iVar1) *
                           (uint)*(ushort *)(lVar4 + (ulong)(i * src1_stride + j) * 2) + 0x20) >> 6)
        ;
      }
    }
  }
  return;
}

Assistant:

void aom_highbd_blend_a64_mask_c(uint8_t *dst_8, uint32_t dst_stride,
                                 const uint8_t *src0_8, uint32_t src0_stride,
                                 const uint8_t *src1_8, uint32_t src1_stride,
                                 const uint8_t *mask, uint32_t mask_stride,
                                 int w, int h, int subw, int subh, int bd) {
  int i, j;
  uint16_t *dst = CONVERT_TO_SHORTPTR(dst_8);
  const uint16_t *src0 = CONVERT_TO_SHORTPTR(src0_8);
  const uint16_t *src1 = CONVERT_TO_SHORTPTR(src1_8);
  (void)bd;

  assert(IMPLIES(src0 == dst, src0_stride == dst_stride));
  assert(IMPLIES(src1 == dst, src1_stride == dst_stride));

  assert(h >= 1);
  assert(w >= 1);
  assert(IS_POWER_OF_TWO(h));
  assert(IS_POWER_OF_TWO(w));

  assert(bd == 8 || bd == 10 || bd == 12);

  if (subw == 0 && subh == 0) {
    for (i = 0; i < h; ++i) {
      for (j = 0; j < w; ++j) {
        const int m = mask[i * mask_stride + j];
        dst[i * dst_stride + j] = AOM_BLEND_A64(m, src0[i * src0_stride + j],
                                                src1[i * src1_stride + j]);
      }
    }
  } else if (subw == 1 && subh == 1) {
    for (i = 0; i < h; ++i) {
      for (j = 0; j < w; ++j) {
        const int m = ROUND_POWER_OF_TWO(
            mask[(2 * i) * mask_stride + (2 * j)] +
                mask[(2 * i + 1) * mask_stride + (2 * j)] +
                mask[(2 * i) * mask_stride + (2 * j + 1)] +
                mask[(2 * i + 1) * mask_stride + (2 * j + 1)],
            2);
        dst[i * dst_stride + j] = AOM_BLEND_A64(m, src0[i * src0_stride + j],
                                                src1[i * src1_stride + j]);
      }
    }
  } else if (subw == 1 && subh == 0) {
    for (i = 0; i < h; ++i) {
      for (j = 0; j < w; ++j) {
        const int m = AOM_BLEND_AVG(mask[i * mask_stride + (2 * j)],
                                    mask[i * mask_stride + (2 * j + 1)]);
        dst[i * dst_stride + j] = AOM_BLEND_A64(m, src0[i * src0_stride + j],
                                                src1[i * src1_stride + j]);
      }
    }
  } else {
    for (i = 0; i < h; ++i) {
      for (j = 0; j < w; ++j) {
        const int m = AOM_BLEND_AVG(mask[(2 * i) * mask_stride + j],
                                    mask[(2 * i + 1) * mask_stride + j]);
        dst[i * dst_stride + j] = AOM_BLEND_A64(m, src0[i * src0_stride + j],
                                                src1[i * src1_stride + j]);
      }
    }
  }
}